

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

idx_t duckdb::BitStringAggOperation::GetRange<short>(short min,short max)

{
  bool bVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  short in_SI;
  short in_DI;
  unsigned_long val;
  short result;
  int16_t *in_stack_ffffffffffffff98;
  unsigned_long uVar4;
  undefined8 in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [4];
  short in_stack_ffffffffffffffd4;
  short in_stack_ffffffffffffffd6;
  string *in_stack_ffffffffffffffd8;
  InvalidInputException *in_stack_ffffffffffffffe0;
  unsigned_long local_8;
  
  if (in_DI <= in_SI) {
    bVar1 = TrySubtractOperator::Operation<short,short,short>
                      ((int16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30),
                       (int16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98
                      );
    if (bVar1) {
      local_8 = NumericCast<unsigned_long,short,void>(0);
      uVar4 = local_8;
      uVar3 = NumericLimits<unsigned_long>::Maximum();
      if (uVar4 != uVar3) {
        local_8 = local_8 + 1;
      }
    }
    else {
      local_8 = NumericLimits<unsigned_long>::Maximum();
    }
    return local_8;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_30,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)",&local_31);
  InvalidInputException::InvalidInputException<short,short>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6,
             in_stack_ffffffffffffffd4);
  __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}